

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
polyscope::render::getAttributeBufferDataRange<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          AttributeBuffer *buff,size_t ind,size_t count)

{
  pointer puVar1;
  size_t sVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uint32Vals;
  allocator_type local_29;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  (*buff->_vptr_AttributeBuffer[0x20])(&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,count,&local_29);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    puVar1[sVar2] = (ulong)local_28._M_impl.super__Vector_impl_data._M_start[sVar2];
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> getAttributeBufferDataRange<uint64_t>(AttributeBuffer& buff, size_t ind, size_t count) {
  std::vector<uint32_t> uint32Vals = buff.getDataRange_uint32(ind, count);
  std::vector<uint64_t> uint64Vals(count);
  for (size_t i = 0; i < count; i++) {
    uint64Vals[i] = static_cast<uint64_t>(uint32Vals[i]);
  }
  return uint64Vals;
}